

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_simple
                   (char_t *s,char_t end_quote)

{
  char_t *pcVar1;
  bool bVar2;
  gap g;
  gap local_18;
  
  local_18.end = (char_t *)0x0;
  local_18.size = 0;
  do {
    if (((anonymous_namespace)::chartype_table[(byte)*s] & 2) == 0) {
      if (((anonymous_namespace)::chartype_table[((byte *)s)[1]] & 2) != 0) {
        s = (char_t *)((byte *)s + 1);
        goto LAB_00153b39;
      }
      if (((anonymous_namespace)::chartype_table[((byte *)s)[2]] & 2) != 0) {
        s = (char_t *)((byte *)s + 2);
        goto LAB_00153b39;
      }
      bVar2 = ((anonymous_namespace)::chartype_table[((byte *)s)[3]] & 2) == 0;
      if (bVar2) {
        s = (char_t *)((byte *)s + 4);
      }
      else {
        s = (char_t *)((byte *)s + 3);
      }
    }
    else {
LAB_00153b39:
      bVar2 = false;
    }
    if (!bVar2) {
      if (*s == end_quote) {
        pcVar1 = gap::flush(&local_18,s);
        *pcVar1 = '\0';
        return (char_t *)((byte *)s + 1);
      }
      if (*s == 0) {
        return (char_t *)0x0;
      }
      s = (char_t *)((byte *)s + 1);
    }
  } while( true );
}

Assistant:

static char_t* parse_simple(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}